

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O2

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,int p)

{
  int iVar1;
  pointer_type psVar2;
  ushort uVar3;
  allocator<char> local_21;
  
  *(undefined8 *)&(this->sa).super_type.m_storage.dummy_ = 0;
  *(undefined8 *)((long)&(this->sa).super_type.m_storage.dummy_ + 8) = 0;
  (this->sa).super_type.m_initialized = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->host,"0.0.0.0",&local_21);
  this->port = p;
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  psVar2->sin_family = 2;
  iVar1 = this->port;
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  uVar3 = (ushort)iVar1;
  psVar2->sin_port = uVar3 << 8 | uVar3 >> 8;
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  (psVar2->sin_addr).s_addr = 0;
  return;
}

Assistant:

Inet_addr::Impl::Impl( int p ):
  sa(SystemSockAddrIn()), host("0.0.0.0"), port(p)
{
  sa->sin_family = PF_INET;
  sa->sin_port = htons(port);
  sa->sin_addr.s_addr = INADDR_ANY;
}